

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_set(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int in_R8D;
  t_float tVar5;
  
  if (argc < 2) {
    return;
  }
  tVar5 = atom_getfloat(argv);
  uVar4 = (uint)tVar5;
  if ((-1 < (int)uVar4) &&
     (iVar1 = (x->x_alist).l_n, uVar3 = iVar1 - uVar4, uVar3 != 0 && (int)uVar4 <= iVar1)) {
    uVar2 = argc - 1U;
    if ((int)uVar3 <= (int)(argc - 1U)) {
      uVar2 = uVar3;
    }
    alist_copyin(&x->x_alist,(t_symbol *)(ulong)uVar2,(int)argv + 0x10,(t_atom *)(ulong)uVar4,in_R8D
                );
    return;
  }
  pd_error(x,"list_store_set: index %d out of range",(t_atom *)(ulong)uVar4);
  return;
}

Assistant:

static void list_store_set(t_list_store *x, t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1)
    {
        int n, max, onset = atom_getfloat(argv);
        if (onset < 0 || onset >= x->x_alist.l_n)
        {
            pd_error(x, "list_store_set: index %d out of range", onset);
            return;
        }
        argc--; argv++;
        max = x->x_alist.l_n - onset;
        n = (argc > max) ? max : argc;
        alist_copyin(&x->x_alist, s, n, argv, onset);
    }
}